

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O0

void __thiscall Clasp::mt::ParallelSolve::SharedData::SharedData(SharedData *this)

{
  long in_RDI;
  SharedData *this_00;
  PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*> *this_01;
  SharedContext *a_ctx;
  ScheduleStrategy *unaff_retaddr;
  __int_type __i;
  uint32 in_stack_ffffffffffffffec;
  double in_stack_fffffffffffffff0;
  long lVar1;
  
  lVar1 = in_RDI;
  Potassco::StringBuilder::StringBuilder((StringBuilder *)0x220600);
  ScheduleStrategy::ScheduleStrategy
            (unaff_retaddr,(Type)((ulong)lVar1 >> 0x20),(uint32)lVar1,in_stack_fffffffffffffff0,
             in_stack_ffffffffffffffec);
  *(undefined8 *)(in_RDI + 0x68) = 0;
  this_00 = (SharedData *)(in_RDI + 0x78);
  SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>::
  SingleOwnerPtr((SingleOwnerPtr<Clasp::mt::ParallelSolve::SharedData::Generator,_Clasp::DeleteObject>
                  *)this_00);
  Timer<Clasp::RealTime>::Timer((Timer<Clasp::RealTime> *)(in_RDI + 0x80));
  std::mutex::mutex((mutex *)0x22065f);
  std::mutex::mutex((mutex *)0x220670);
  this_01 = (PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*> *
            )(in_RDI + 0xe8);
  condition_variable::condition_variable((condition_variable *)0x220686);
  a_ctx = (SharedContext *)(in_RDI + 0x118);
  PodQueue<const_bk_lib::pod_vector<Clasp::Literal,_std::allocator<Clasp::Literal>_>_*>::PodQueue
            (this_01);
  __i = (__int_type)((ulong)this_01 >> 0x20);
  LowerBound::LowerBound((LowerBound *)(in_RDI + 0x138));
  reset(this_00,a_ctx);
  std::__atomic_base<unsigned_int>::operator=((__atomic_base<unsigned_int> *)a_ctx,__i);
  return;
}

Assistant:

SharedData() : path(0) { reset(0); control = 0; }